

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_find_first.c
# Opt level: O3

void * linkedlist_find_first(s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg)

{
  e_matcher_result eVar1;
  
  do {
    linked_list = (s_linkedlist *)((s_linkedlist_node *)linked_list)->next;
    if ((s_linkedlist_node *)linked_list == (s_linkedlist_node *)0x0) {
      return (void *)0x0;
    }
    eVar1 = (*matcher)(((s_linkedlist_node *)linked_list)->element,matcher_arg);
  } while (eVar1 != E_MATCHER_RESULT_MATCH);
  return ((s_linkedlist_node *)linked_list)->element;
}

Assistant:

void *linkedlist_find_first(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            return node->element;
        }

        node = node->next;
    }

    return NULL;
}